

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestarrays::runTestCase(TestValueTestarrays *this)

{
  bool bVar1;
  Value *expr;
  Value *other;
  Value *this_00;
  char *in_RDI;
  Value got;
  Value *constArray;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  IsCheck checks;
  uint index0;
  Value *in_stack_fffffffffffffc48;
  uint line;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  char *in_stack_fffffffffffffc58;
  undefined2 uVar2;
  Value *in_stack_fffffffffffffc60;
  TestResult *result;
  char *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  Value *in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffca0;
  ValueType other_00;
  Value *in_stack_fffffffffffffca8;
  Value *in_stack_fffffffffffffcc8;
  Value *this_01;
  uint uVar3;
  Value *in_stack_fffffffffffffcf0;
  Value *in_stack_fffffffffffffcf8;
  TestResult *in_stack_fffffffffffffd00;
  IsCheck *in_stack_fffffffffffffd10;
  Value *in_stack_fffffffffffffd18;
  ValueTest *in_stack_fffffffffffffd20;
  PredicateContext *in_stack_fffffffffffffd48;
  ArrayIndex in_stack_fffffffffffffd54;
  Value *in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffdfc;
  Value *in_stack_fffffffffffffe00;
  ArrayIndex in_stack_fffffffffffffe44;
  Value *in_stack_fffffffffffffe48;
  ArrayIndex in_stack_fffffffffffffec4;
  Value *in_stack_fffffffffffffec8;
  undefined4 local_78 [2];
  char *local_70;
  undefined4 local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48 [2];
  char *local_40;
  undefined4 local_38;
  char *local_30;
  undefined8 local_28;
  undefined8 local_20;
  IsCheck local_18;
  undefined4 local_c;
  
  other_00 = (ValueType)((ulong)in_stack_fffffffffffffca0 >> 0x20);
  local_c = 0;
  ValueTest::IsCheck::IsCheck(&local_18);
  local_18.isArray_ = true;
  local_48[0] = **(undefined4 **)(in_RDI + 8);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_38 = 0xdd;
  local_30 = "checkIs(emptyArray_, checks)";
  local_28 = 0;
  local_20 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_48;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_48;
  ValueTest::checkIs(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_78[0] = **(undefined4 **)(in_RDI + 8);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_68 = 0xde;
  local_60 = "checkIs(array1_, checks)";
  local_58 = 0;
  local_50 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_78;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_78;
  ValueTest::checkIs(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  uVar3 = (uint)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
  Json::Value::type((Value *)(in_RDI + 0x150));
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            ((TestResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
             (ValueType)((ulong)in_stack_fffffffffffffc68 >> 0x20),
             (ValueType)in_stack_fffffffffffffc68,(char *)in_stack_fffffffffffffc60,
             (uint)((ulong)in_stack_fffffffffffffc58 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffca8,other_00);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,(uint)((ulong)in_stack_fffffffffffffc60 >> 0x20),
               in_stack_fffffffffffffc58);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffca8,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,(uint)((ulong)in_stack_fffffffffffffc60 >> 0x20),
               in_stack_fffffffffffffc58);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffca8,other_00);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,(uint)((ulong)in_stack_fffffffffffffc60 >> 0x20),
               in_stack_fffffffffffffc58);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffca8,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,(uint)((ulong)in_stack_fffffffffffffc60 >> 0x20),
               in_stack_fffffffffffffc58);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffca8,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,(uint)((ulong)in_stack_fffffffffffffc60 >> 0x20),
               in_stack_fffffffffffffc58);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffca8,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,(uint)((ulong)in_stack_fffffffffffffc60 >> 0x20),
               in_stack_fffffffffffffc58);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffca8,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,(uint)((ulong)in_stack_fffffffffffffc60 >> 0x20),
               in_stack_fffffffffffffc58);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffca8,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,(uint)((ulong)in_stack_fffffffffffffc60 >> 0x20),
               in_stack_fffffffffffffc58);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffca8,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,(uint)((ulong)in_stack_fffffffffffffc60 >> 0x20),
               in_stack_fffffffffffffc58);
  }
  this_01 = *(Value **)(in_RDI + 8);
  Json::Value::Value((Value *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                     (Int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  expr = Json::Value::operator[](in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  Json::Value::Value(this_01,in_stack_fffffffffffffcc8);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_RDI,
             uVar3,(char *)expr);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::Value((Value *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                     (Int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  other = Json::Value::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_RDI,
             uVar3,(char *)expr);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::Value((Value *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                     (Int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  Json::Value::operator[](in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_RDI,
             uVar3,(char *)expr);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::Value((Value *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                     (Int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  Json::Value::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_RDI,
             uVar3,(char *)expr);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::Value((Value *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                     (Int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  Json::Value::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  Json::Value::operator=
            ((Value *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             in_stack_fffffffffffffc48);
  line = (uint)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::Value(in_stack_fffffffffffffc60,(ValueType)((ulong)in_stack_fffffffffffffc58 >> 0x20)
                    );
  Json::Value::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_RDI,
             uVar3,(char *)expr);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::~Value(in_stack_fffffffffffffc80);
  Json::Value::Value((Value *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),line);
  this_00 = Json::Value::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_RDI,
             uVar3,(char *)expr);
  Json::Value::~Value(this_00);
  Json::Value::~Value(this_00);
  result = (TestResult *)&stack0xfffffffffffffd40;
  Json::Value::Value((Value *)result,(ValueType)((ulong)in_stack_fffffffffffffc58 >> 0x20));
  uVar2 = (undefined2)((ulong)in_stack_fffffffffffffc58 >> 0x30);
  Json::Value::removeIndex
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,(Value *)in_stack_fffffffffffffd48)
  ;
  JsonTest::checkEqual<bool,bool>
            (result,SUB21((ushort)uVar2 >> 8,0),SUB21(uVar2,0),
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),line,
             (char *)0x146f6d);
  uVar2 = (undefined2)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x30);
  Json::Value::Value((Value *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),line);
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_RDI,
             uVar3,(char *)expr);
  Json::Value::~Value(this_00);
  Json::Value::~Value(this_00);
  uVar3 = (uint)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
  bVar1 = Json::Value::removeIndex
                    (in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,
                     (Value *)in_stack_fffffffffffffd48);
  JsonTest::checkEqual<bool,bool>
            (result,SUB21((ushort)uVar2 >> 8,0),SUB21(uVar2,0),
             (char *)CONCAT17(bVar1,in_stack_fffffffffffffc50),uVar3,(char *)0x14704d);
  Json::Value::~Value(this_00);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, arrays) {
  const unsigned int index0 = 0;

  // Types
  IsCheck checks;
  checks.isArray_ = true;
  JSONTEST_ASSERT_PRED(checkIs(emptyArray_, checks));
  JSONTEST_ASSERT_PRED(checkIs(array1_, checks));

  JSONTEST_ASSERT_EQUAL(Json::arrayValue, array1_.type());

  // Empty array okay
  JSONTEST_ASSERT(emptyArray_.isConvertibleTo(Json::nullValue));

  // Non-empty array not okay
  JSONTEST_ASSERT(!array1_.isConvertibleTo(Json::nullValue));

  // Always okay
  JSONTEST_ASSERT(emptyArray_.isConvertibleTo(Json::arrayValue));

  // Never okay
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::objectValue));
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::stringValue));

  // Access through const reference
  const Json::Value& constArray = array1_;
  JSONTEST_ASSERT_EQUAL(Json::Value(1234), constArray[index0]);
  JSONTEST_ASSERT_EQUAL(Json::Value(1234), constArray[0]);

  // Access through non-const reference
  JSONTEST_ASSERT_EQUAL(Json::Value(1234), array1_[index0]);
  JSONTEST_ASSERT_EQUAL(Json::Value(1234), array1_[0]);

  array1_[2] = Json::Value(17);
  JSONTEST_ASSERT_EQUAL(Json::Value(), array1_[1]);
  JSONTEST_ASSERT_EQUAL(Json::Value(17), array1_[2]);
  Json::Value got;
  JSONTEST_ASSERT_EQUAL(true, array1_.removeIndex(2, &got));
  JSONTEST_ASSERT_EQUAL(Json::Value(17), got);
  JSONTEST_ASSERT_EQUAL(false, array1_.removeIndex(2, &got)); // gone now
}